

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSValue js_os_signal(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int64_t iVar1;
  JSValueUnion JVar2;
  list_head *plVar3;
  undefined1 auVar4 [16];
  BOOL BVar5;
  int iVar6;
  undefined8 in_RAX;
  JSRuntime *pJVar7;
  JSThreadState *ts;
  JSOSSignalHandler *pJVar8;
  ulong uVar9;
  uint32_t uVar10;
  code *__handler;
  char *fmt;
  uint uVar11;
  JSRefCountHeader *p;
  JSValue JVar12;
  JSValue JVar13;
  ulong uStack_40;
  uint32_t sig_num;
  
  sig_num = (uint32_t)((ulong)in_RAX >> 0x20);
  pJVar7 = JS_GetRuntime(ctx);
  ts = (JSThreadState *)JS_GetRuntimeOpaque(pJVar7);
  BVar5 = is_main_thread(pJVar7);
  if (BVar5 == 0) {
    fmt = "signal handler can only be set in the main thread";
LAB_00110ada:
    JVar12 = JS_ThrowTypeError(ctx,fmt);
LAB_00110b00:
    uVar9 = (ulong)JVar12.u.ptr & 0xffffffff00000000;
  }
  else {
    iVar6 = JS_ToInt32(ctx,(int32_t *)&sig_num,*argv);
    uVar10 = sig_num;
    uStack_40 = 6;
    if (iVar6 == 0) {
      if (0x3f < sig_num) {
        JVar12 = JS_ThrowRangeError(ctx,"invalid signal number");
        goto LAB_00110b00;
      }
      iVar1 = argv[1].tag;
      uVar11 = (uint)iVar1;
      if ((uVar11 & 0xfffffffe) == 2) {
        pJVar8 = find_sh(ts,sig_num);
        if (pJVar8 != (JSOSSignalHandler *)0x0) {
          pJVar7 = JS_GetRuntime(ctx);
          free_sh(pJVar7,pJVar8);
          uVar10 = sig_num;
        }
        __handler = (code *)(ulong)(uVar11 != 2);
        sig_num = uVar10;
      }
      else {
        JVar2 = (JSValueUnion)argv[1].u.ptr;
        JVar12.tag = iVar1;
        JVar12.u.ptr = JVar2.ptr;
        iVar6 = JS_IsFunction(ctx,JVar12);
        if (iVar6 == 0) {
          fmt = "not a function";
          goto LAB_00110ada;
        }
        pJVar8 = find_sh(ts,sig_num);
        if (pJVar8 == (JSOSSignalHandler *)0x0) {
          pJVar8 = (JSOSSignalHandler *)js_mallocz(ctx,0x28);
          if (pJVar8 == (JSOSSignalHandler *)0x0) goto LAB_00110acd;
          pJVar8->sig_num = sig_num;
          plVar3 = (ts->os_signal_handlers).prev;
          plVar3->next = (list_head *)pJVar8;
          (pJVar8->link).prev = plVar3;
          (pJVar8->link).next = &ts->os_signal_handlers;
          (ts->os_signal_handlers).prev = (list_head *)pJVar8;
        }
        JS_FreeValue(ctx,pJVar8->func);
        if (0xfffffff4 < uVar11) {
          *(int *)JVar2.ptr = *JVar2.ptr + 1;
        }
        (pJVar8->func).u.ptr = (void *)JVar2;
        (pJVar8->func).tag = iVar1;
        __handler = os_signal_handler;
      }
      signal(sig_num,__handler);
      uStack_40 = 3;
    }
LAB_00110acd:
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uStack_40;
    JVar12 = (JSValue)(auVar4 << 0x40);
    uVar9 = 0;
  }
  JVar13.u.ptr = (void *)((ulong)JVar12.u.ptr & 0xffffffff | uVar9);
  JVar13.tag = JVar12.tag;
  return JVar13;
}

Assistant:

static JSValue js_os_signal(JSContext *ctx, JSValueConst this_val,
                            int argc, JSValueConst *argv)
{
    JSRuntime *rt = JS_GetRuntime(ctx);
    JSThreadState *ts = JS_GetRuntimeOpaque(rt);
    JSOSSignalHandler *sh;
    uint32_t sig_num;
    JSValueConst func;
    sighandler_t handler;

    if (!is_main_thread(rt))
        return JS_ThrowTypeError(ctx, "signal handler can only be set in the main thread");
    
    if (JS_ToUint32(ctx, &sig_num, argv[0]))
        return JS_EXCEPTION;
    if (sig_num >= 64)
        return JS_ThrowRangeError(ctx, "invalid signal number");
    func = argv[1];
    /* func = null: SIG_DFL, func = undefined, SIG_IGN */
    if (JS_IsNull(func) || JS_IsUndefined(func)) {
        sh = find_sh(ts, sig_num);
        if (sh) {
            free_sh(JS_GetRuntime(ctx), sh);
        }
        if (JS_IsNull(func))
            handler = SIG_DFL;
        else
            handler = SIG_IGN;
        signal(sig_num, handler);
    } else {
        if (!JS_IsFunction(ctx, func))
            return JS_ThrowTypeError(ctx, "not a function");
        sh = find_sh(ts, sig_num);
        if (!sh) {
            sh = js_mallocz(ctx, sizeof(*sh));
            if (!sh)
                return JS_EXCEPTION;
            sh->sig_num = sig_num;
            list_add_tail(&sh->link, &ts->os_signal_handlers);
        }
        JS_FreeValue(ctx, sh->func);
        sh->func = JS_DupValue(ctx, func);
        signal(sig_num, os_signal_handler);
    }
    return JS_UNDEFINED;
}